

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorDisposer.cpp
# Opt level: O1

void __thiscall ApprovalTests::ComparatorDisposer::~ComparatorDisposer(ComparatorDisposer *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  mapped_type *pmVar2;
  
  if (this->isActive == true) {
    pmVar2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>_>
             ::operator[](this->comparators,&this->ext_);
    (pmVar2->super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr = (this->previousComparator).
             super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar2->
                super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,
               &(this->previousComparator).
                super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  this_00 = (this->previousComparator).
            super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar1 = (this->ext_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->ext_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

ComparatorDisposer::~ComparatorDisposer()
    {
        if (isActive)
        {
            comparators[ext_] = previousComparator;
        }
    }